

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputBuffer.cpp
# Opt level: O3

uint __thiscall antlr::InputBuffer::mark(InputBuffer *this)

{
  pointer __src;
  ulong uVar1;
  pointer piVar2;
  ulong uVar3;
  size_t sVar4;
  pointer piVar5;
  ulong uVar6;
  pointer piVar7;
  
  uVar6 = (ulong)this->numToConsume;
  if (uVar6 != 0) {
    if (this->nMarkers == 0) {
      piVar7 = (this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar2 = (this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar1 = (this->queue).m_offset;
      uVar3 = ((long)piVar2 - (long)piVar7 >> 2) - uVar1;
      if (uVar6 <= uVar3) {
        uVar3 = uVar6;
      }
      if (uVar1 < 5000) {
        sVar4 = uVar3 + uVar1;
      }
      else {
        __src = piVar7 + uVar1 + uVar3;
        if (piVar7 != __src) {
          piVar5 = __src;
          if ((long)piVar2 - (long)__src != 0) {
            memmove(piVar7,__src,(long)piVar2 - (long)__src);
            piVar2 = (this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            piVar5 = piVar2;
          }
          piVar7 = (pointer)((long)piVar7 + ((long)piVar5 - (long)__src));
          if (piVar2 != piVar7) {
            (this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = piVar7;
          }
        }
        sVar4 = 0;
      }
      (this->queue).m_offset = sVar4;
    }
    else {
      this->markerOffset = this->markerOffset + this->numToConsume;
    }
    this->numToConsume = 0;
  }
  this->nMarkers = this->nMarkers + 1;
  return this->markerOffset;
}

Assistant:

unsigned int InputBuffer::mark()
{
	syncConsume();
	nMarkers++;
	return markerOffset;
}